

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

double __thiscall despot::Parser::LogNumStates(Parser *this)

{
  pointer pSVar1;
  long lVar2;
  int i;
  ulong uVar3;
  double dVar4;
  __type _Var5;
  
  dVar4 = 0.0;
  lVar2 = 0x10;
  for (uVar3 = 0;
      pSVar1 = (this->curr_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->curr_state_vars_).
                             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0xc0);
      uVar3 = uVar3 + 1) {
    _Var5 = std::log2<int>((int)((ulong)(*(long *)((long)&(pSVar1->super_NamedVar).super_Variable.
                                                          _vptr_Variable + lVar2) -
                                        *(long *)((long)pSVar1 + lVar2 + -8)) >> 5));
    dVar4 = dVar4 + _Var5;
    lVar2 = lVar2 + 0xc0;
  }
  return dVar4;
}

Assistant:

double Parser::LogNumStates() const {
	double log_num_states = 0;

	for (int i = 0; i < curr_state_vars_.size(); i++) {
		log_num_states += log2(curr_state_vars_[i].Size());
	}

	return log_num_states;
}